

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMFormat_conflict server_get_format(FMContext iocontext,void *buffer)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  void *in_RSI;
  FMContext in_RDI;
  FMContext unaff_retaddr;
  format_rep rep;
  char return_char;
  unsigned_short length;
  char block_version;
  char get [2];
  int retry_count;
  int id_size;
  FMFormat_conflict format;
  FMContext fmc;
  uint16_t *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  char cVar4;
  uint16_t in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcc;
  char in_stack_ffffffffffffffcd;
  undefined1 uVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  FMFormat_conflict local_28;
  FMContext rep_00;
  FMFormat_conflict in_stack_fffffffffffffff8;
  
  local_28 = (FMFormat_conflict)0x0;
  iVar8 = 8;
  iVar7 = 0;
  rep_00 = in_RDI;
LAB_00126631:
  do {
    if (3 < iVar7) {
      return (FMFormat_conflict)0x0;
    }
    iVar2 = (*establish_server_connection_ptr)(in_RDI,host_and_fallback);
    if (iVar2 == 0) {
      iVar8 = (*establish_server_connection_ptr)(in_RDI,host_and_fallback);
      iVar2 = (int)((ulong)rep_00 >> 0x20);
      iVar7 = (int)((ulong)in_RDI >> 0x20);
      if (iVar8 == 0) {
        printf("Failed to contact format server\n");
        exit(1);
      }
LAB_001269b7:
      if (local_28 == (FMFormat_conflict)0x0) {
        return (FMFormat_conflict)0x0;
      }
      add_format_to_iofile(unaff_retaddr,in_stack_fffffffffffffff8,iVar2,in_RSI,iVar7);
      return local_28;
    }
    uVar5 = 0x67;
    uVar6 = '\b';
    cVar4 = '\0';
    uVar3 = version_of_format_ID(in_RSI);
    if (uVar3 < 3) {
      iVar8 = version_of_format_ID(in_RSI);
      uVar6 = ID_length[iVar8];
      iVar8 = (int)(char)uVar6;
    }
    iVar2 = serverAtomicWrite((void *)CONCAT44(iVar8,iVar7),
                              (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(cVar4,
                                                  in_stack_ffffffffffffffc8)))))),
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar2 != 2) {
      perror("write to Format server failed");
      return (FMFormat_conflict)0x0;
    }
    iVar2 = serverAtomicWrite((void *)CONCAT44(iVar8,iVar7),
                              (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(cVar4,
                                                  in_stack_ffffffffffffffc8)))))),
                              (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar2 != iVar8) {
      perror("write to Format server failed");
      return (FMFormat_conflict)0x0;
    }
    iVar2 = serverAtomicRead((void *)CONCAT44(iVar8,iVar7),
                             (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(cVar4,
                                                  in_stack_ffffffffffffffc8)))))),
                             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar2 == 1) {
      if (cVar4 == 'P') {
        provisional_use_warning(0);
        iVar2 = serverAtomicRead((void *)CONCAT44(iVar8,iVar7),
                                 (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(cVar4,
                                                  in_stack_ffffffffffffffc8)))))),
                                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        if (iVar2 != 1) {
          iVar2 = get_format_server_verbose();
          if (iVar2 != 0) {
            printf("Retrying because of failed read\a\a\n");
          }
          iVar7 = iVar7 + 1;
          goto LAB_00126631;
        }
      }
      if (cVar4 == 'f') {
        iVar2 = serverAtomicRead((void *)CONCAT44(iVar8,iVar7),
                                 (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(0x66,
                                                  in_stack_ffffffffffffffc8)))))),
                                 (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        if (iVar2 == 1) {
          if (in_stack_ffffffffffffffcd != '\x01') {
            iVar8 = get_format_server_verbose();
            if (iVar8 != 0) {
              fprintf(_stderr,"Unknown version \"%d\"in block registration\n",
                      (ulong)(uint)(int)in_stack_ffffffffffffffcd);
            }
            return (FMFormat_conflict)0x0;
          }
          iVar2 = serverAtomicRead((void *)CONCAT44(iVar8,iVar7),
                                   (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(1,CONCAT14(
                                                  in_stack_ffffffffffffffcc,
                                                  CONCAT22(in_stack_ffffffffffffffca,
                                                           CONCAT11(cVar4,in_stack_ffffffffffffffc8)
                                                          ))))),
                                   (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
          if (iVar2 != 2) {
            iVar2 = get_format_server_verbose();
            if (iVar2 != 0) {
              printf("Retrying because of failed read\a\a\n");
            }
            iVar7 = iVar7 + 1;
            goto LAB_00126631;
          }
          in_stack_ffffffffffffffca = ntohs(in_stack_ffffffffffffffca);
          if (in_stack_ffffffffffffffca == 0) {
            local_28 = (FMFormat_conflict)0x0;
          }
          else {
            in_stack_ffffffffffffffc0 = (uint16_t *)ffs_malloc((size_t)in_stack_ffffffffffffffc0);
            uVar1 = htons(in_stack_ffffffffffffffca);
            *in_stack_ffffffffffffffc0 = uVar1;
            iVar2 = serverAtomicRead((void *)CONCAT44(iVar8,iVar7),
                                     (void *)CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  CONCAT14(in_stack_ffffffffffffffcc,
                                                           CONCAT22(in_stack_ffffffffffffffca,
                                                                    CONCAT11(cVar4,
                                                  in_stack_ffffffffffffffc8)))))),
                                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
            if ((long)iVar2 != (ulong)in_stack_ffffffffffffffca - 2) {
              iVar2 = get_format_server_verbose();
              if (iVar2 != 0) {
                printf("Retrying because of failed read\a\a\n");
              }
              iVar7 = iVar7 + 1;
              goto LAB_00126631;
            }
            local_28 = expand_format_from_rep((format_rep)rep_00);
          }
          iVar2 = (int)((ulong)rep_00 >> 0x20);
          iVar7 = (int)((ulong)in_RDI >> 0x20);
          goto LAB_001269b7;
        }
        iVar2 = get_format_server_verbose();
        if (iVar2 != 0) {
          printf("Retrying because of failed read\a\a\n");
        }
        iVar7 = iVar7 + 1;
      }
      else {
        iVar2 = get_format_server_verbose();
        if (iVar2 != 0) {
          printf("Retrying because of failed read\a\a\n");
        }
        iVar7 = iVar7 + 1;
      }
      goto LAB_00126631;
    }
    iVar2 = get_format_server_verbose();
    if (iVar2 != 0) {
      printf("Retrying because of failed read\a\a\n");
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

static FMFormat
server_get_format(FMContext iocontext, void *buffer)
{
    FMContext fmc = (FMContext) iocontext;
    FMFormat format = NULL;
    int id_size = 8;
    int retry_count = 0;

  retry:
    if (retry_count > 3)
	return NULL;
    if (establish_server_connection_ptr == NULL) {
	assert(0);
    }
    if (establish_server_connection_ptr(fmc, host_and_fallback) == 0) {
	if (establish_server_connection_ptr(fmc, host_and_fallback) == 0) {
	    printf("Failed to contact format server\n");
	    exit(1);
	}
    } else {
	char get[2] =
	{'g', 8};		/* format get, size */
	char block_version;
	UINT2 length;
	char return_char = 0;
	format_rep rep;

	if (version_of_format_ID(buffer) < sizeof(ID_length)) {
	    id_size = get[1] = ID_length[version_of_format_ID(buffer)];
	}
	if (serverAtomicWrite(fmc->server_fd, &get[0], 2) != 2) {
	    perror("write to Format server failed");
	    return NULL;
	}
	if (serverAtomicWrite(fmc->server_fd, buffer, id_size) != id_size) {
	    perror("write to Format server failed");
	    return NULL;
	}
	if (serverAtomicRead(fmc->server_fd, &return_char, 1) != 1) {
	    if (get_format_server_verbose()) {
		printf("Retrying because of failed read\n");
	    }
	    retry_count++;
	    goto retry;
	}
	if (return_char == 'P') {
	    provisional_use_warning((int) (intptr_t) fmc->server_fd);
	    if (serverAtomicRead(fmc->server_fd, &return_char, 1) != 1) {
		if (get_format_server_verbose()) {
		    printf("Retrying because of failed read\n");
		}
		retry_count++;
		goto retry;
	    }
	}
	if (return_char != 'f') {
	    if (get_format_server_verbose()) {
		printf("Retrying because of failed read\n");
	    }
	    retry_count++;
	    goto retry;
	}
	if (serverAtomicRead(fmc->server_fd, &block_version, 1) != 1) {
	    if (get_format_server_verbose()) {
		printf("Retrying because of failed read\n");
	    }
	    retry_count++;
	    goto retry;
	}
	if (block_version != 1) {
	    if (get_format_server_verbose()) {
		fprintf(stderr, "Unknown version \"%d\"in block registration\n", block_version);
	    }
	    return NULL;
	}
	if (serverAtomicRead(fmc->server_fd, &length, sizeof(length)) !=
	    sizeof(length)) {
	    if (get_format_server_verbose()) {
		printf("Retrying because of failed read\n");
	    }
	    retry_count++;
	    goto retry;
	}
	length = ntohs(length);
	if (length == 0) {
	    format = NULL;
	} else {
	    rep = malloc(length);
	    rep->format_rep_length = htons((short)length);
	    if (serverAtomicRead(fmc->server_fd, ((char *) rep) + sizeof(length),
		 length - sizeof(length)) != (length - sizeof(length))) {
		if (get_format_server_verbose()) {
		    printf("Retrying because of failed read\n");
		}
		retry_count++;
		goto retry;
	    }
	    format = expand_format_from_rep(rep);

	}
    }
    if (format == NULL)
	return NULL;
    add_format_to_iofile(fmc, format, id_size, buffer, -1);
    return format;
}